

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_cdef_init_fb_row_mt
               (AV1_COMMON *cm,MACROBLOCKD *xd,CdefBlockInfo *fb_info,uint16_t **linebuf,
               uint16_t *src,AV1CdefSyncData *cdef_sync,int fbr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  undefined8 in_R8;
  uint in_stack_00000008;
  int bot_offset;
  int top_offset;
  int mi_high_l2;
  uint16_t *bot_linebuf;
  uint16_t *top_linebuf;
  int stride;
  int plane;
  int luma_stride;
  int nvfb;
  int num_planes;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff94;
  int sstride;
  int in_stack_ffffffffffffffb8;
  int hsize;
  
  iVar2 = av1_num_planes(in_RDI);
  iVar3 = ((in_RDI->mi_params).mi_rows + 0xf) / 0x10;
  iVar1 = (in_RDI->mi_params).mi_cols;
  *(uint *)(in_RDX + 0x4a) = (uint)((in_stack_00000008 & 0xfffffff) == 0);
  if (in_stack_00000008 == iVar3 - 1U) {
    *(undefined4 *)(in_RDX + 0x4b) = 1;
  }
  else {
    *(uint *)(in_RDX + 0x4b) = (uint)((in_stack_00000008 + 1) * 0x10 == (in_RDI->mi_params).mi_rows)
    ;
  }
  *in_RDX = in_R8;
  *(int *)(in_RDX + 0x4c) = (in_RDI->cdef_info).cdef_damping;
  if (in_RDI->seq_params->bit_depth == AOM_BITS_8) {
    iVar4 = 0;
  }
  else {
    iVar4 = in_RDI->seq_params->bit_depth - AOM_BITS_8;
  }
  *(int *)((long)in_RDX + 0x264) = iVar4;
  memset((void *)((long)in_RDX + 0x274),0,0x400);
  memset((void *)((long)in_RDX + 0x674),0,0x400);
  for (hsize = 0; hsize < iVar2; hsize = hsize + 1) {
    iVar5 = (int)(iVar1 * 4 + 0xfU & 0xfffffff0) >>
            ((byte)*(undefined4 *)(in_RSI + (long)hsize * 0xa30 + 0x14) & 0x1f);
    sstride = (int)*(undefined8 *)(in_RCX + (long)hsize * 8);
    iVar6 = 2 - *(int *)(in_RSI + (long)hsize * 0xa30 + 0x18);
    iVar7 = (in_stack_00000008 + 1) * 0x10 << ((byte)iVar6 & 0x1f);
    iVar8 = (in_stack_00000008 + 1) * 0x10 << ((byte)iVar6 & 0x1f);
    if (in_stack_00000008 != iVar3 - 1U) {
      in_stack_ffffffffffffff80 = 2;
      av1_cdef_copy_sb8_16
                ((AV1_COMMON *)CONCAT44(iVar6,iVar7),(uint16_t *)CONCAT44(iVar8,iVar4),
                 in_stack_ffffffffffffff94,(uint8_t *)CONCAT44(in_stack_ffffffffffffff8c,iVar5),
                 in_stack_ffffffffffffff84,2,sstride,in_stack_ffffffffffffffb8,hsize);
    }
    if (in_stack_00000008 != iVar3 - 1U) {
      in_stack_ffffffffffffff80 = 2;
      av1_cdef_copy_sb8_16
                ((AV1_COMMON *)CONCAT44(iVar6,iVar7),(uint16_t *)CONCAT44(iVar8,iVar4),
                 in_stack_ffffffffffffff94,(uint8_t *)CONCAT44(in_stack_ffffffffffffff8c,iVar5),
                 in_stack_ffffffffffffff84,2,sstride,in_stack_ffffffffffffffb8,hsize);
    }
    in_RDX[(long)hsize + 1] =
         *(long *)(in_RCX + (long)hsize * 8) + (long)(int)(in_stack_00000008 * 2 * iVar5) * 2;
    in_RDX[(long)hsize + 4] =
         *(long *)(in_RCX + (long)hsize * 8) +
         (long)(int)(iVar3 * 2 * iVar5 + in_stack_00000008 * 2 * iVar5) * 2;
  }
  cdef_row_mt_sync_write
            ((AV1CdefSync *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c);
  cdef_row_mt_sync_read
            ((AV1CdefSync *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c);
  return;
}

Assistant:

void av1_cdef_init_fb_row_mt(const AV1_COMMON *const cm,
                             const MACROBLOCKD *const xd,
                             CdefBlockInfo *const fb_info,
                             uint16_t **const linebuf, uint16_t *const src,
                             struct AV1CdefSyncData *const cdef_sync, int fbr) {
  const int num_planes = av1_num_planes(cm);
  const int nvfb = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int luma_stride =
      ALIGN_POWER_OF_TWO(cm->mi_params.mi_cols << MI_SIZE_LOG2, 4);

  // for the current filter block, it's top left corner mi structure (mi_tl)
  // is first accessed to check whether the top and left boundaries are
  // frame boundaries. Then bottom-left and top-right mi structures are
  // accessed to check whether the bottom and right boundaries
  // (respectively) are frame boundaries.
  //
  // Note that we can't just check the bottom-right mi structure - eg. if
  // we're at the right-hand edge of the frame but not the bottom, then
  // the bottom-right mi is NULL but the bottom-left is not.
  fb_info->frame_boundary[TOP] = (MI_SIZE_64X64 * fbr == 0) ? 1 : 0;
  if (fbr != nvfb - 1)
    fb_info->frame_boundary[BOTTOM] =
        (MI_SIZE_64X64 * (fbr + 1) == cm->mi_params.mi_rows) ? 1 : 0;
  else
    fb_info->frame_boundary[BOTTOM] = 1;

  fb_info->src = src;
  fb_info->damping = cm->cdef_info.cdef_damping;
  fb_info->coeff_shift = AOMMAX(cm->seq_params->bit_depth - 8, 0);
  av1_zero(fb_info->dir);
  av1_zero(fb_info->var);

  for (int plane = 0; plane < num_planes; plane++) {
    const int stride = luma_stride >> xd->plane[plane].subsampling_x;
    uint16_t *top_linebuf = &linebuf[plane][0];
    uint16_t *bot_linebuf = &linebuf[plane][nvfb * CDEF_VBORDER * stride];
    {
      const int mi_high_l2 = MI_SIZE_LOG2 - xd->plane[plane].subsampling_y;
      const int top_offset = MI_SIZE_64X64 * (fbr + 1) << mi_high_l2;
      const int bot_offset = MI_SIZE_64X64 * (fbr + 1) << mi_high_l2;

      if (fbr != nvfb - 1)  // if (fbr != 0)  // top line buffer copy
        av1_cdef_copy_sb8_16(
            cm, &top_linebuf[(fbr + 1) * CDEF_VBORDER * stride], stride,
            xd->plane[plane].dst.buf, top_offset - CDEF_VBORDER, 0,
            xd->plane[plane].dst.stride, CDEF_VBORDER, stride);
      if (fbr != nvfb - 1)  // bottom line buffer copy
        av1_cdef_copy_sb8_16(cm, &bot_linebuf[fbr * CDEF_VBORDER * stride],
                             stride, xd->plane[plane].dst.buf, bot_offset, 0,
                             xd->plane[plane].dst.stride, CDEF_VBORDER, stride);
    }

    fb_info->top_linebuf[plane] = &linebuf[plane][fbr * CDEF_VBORDER * stride];
    fb_info->bot_linebuf[plane] =
        &linebuf[plane]
                [nvfb * CDEF_VBORDER * stride + (fbr * CDEF_VBORDER * stride)];
  }

  cdef_row_mt_sync_write(cdef_sync, fbr);
  cdef_row_mt_sync_read(cdef_sync, fbr);
}